

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_r6p_iter.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  
  bVar1 = testR6PIter();
  if (!bVar1) {
    std::operator<<((ostream *)&std::cerr,"R6PIter test did not pass\n");
  }
  else {
    std::operator<<((ostream *)&std::cout,"R6PIter test passed\n");
  }
  return (uint)!bVar1;
}

Assistant:

int main(int argc, char ** argv){


if(testR6PIter()){
    std::cout << "R6PIter test passed\n";
}else{
    std::cerr << "R6PIter test did not pass\n";
    return 1;
};

return 0;
}